

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

gnode_t * parse_parentheses_expression(gravity_parser_t *parser)

{
  gnode_t *pgVar1;
  
  parse_required(parser,TOK_OP_OPEN_PARENTHESIS);
  pgVar1 = parse_precedence(parser,PREC_LOWEST);
  if (pgVar1 != (gnode_t *)0x0) {
    parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
  }
  return pgVar1;
}

Assistant:

static gnode_t *parse_parentheses_expression (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_parentheses_expression");

    // check and consume TOK_OP_OPEN_PARENTHESIS
    parse_required(parser, TOK_OP_OPEN_PARENTHESIS);

    // parse expression
    gnode_t *expr = parse_expression(parser);
    CHECK_NODE(expr);

    // check and consume TOK_OP_CLOSED_PARENTHESIS
    parse_required(parser, TOK_OP_CLOSED_PARENTHESIS);

    return expr;
}